

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_service_async_client(t_java_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  uint uVar2;
  t_service *ptVar3;
  ostream *poVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  string *psVar6;
  t_type *ttype;
  members_type *this_00;
  t_struct *this_01;
  members_type *this_02;
  t_type *ptVar7;
  reference pptVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_690
  ;
  t_field **local_688;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_680
  ;
  const_iterator x_iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_578
  ;
  t_field **local_570;
  string local_568;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_4a8
  ;
  t_field **local_4a0;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_378
  ;
  t_field **local_370;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator local_261;
  string local_260;
  string local_240;
  undefined1 local_220 [8];
  string result_name;
  string args_name;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string funclassname;
  t_struct *arg_struct;
  t_type *ret_type;
  string local_178;
  undefined1 local_158 [8];
  string javaname;
  undefined1 local_130 [8];
  string sep;
  string funname;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_e8;
  t_function **local_e0;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_d8;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_71;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  string local_38 [8];
  string extends;
  t_service *tservice_local;
  t_java_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"org.apache.thrift.async.TAsyncClient",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    type_name_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this,&ptVar3->super_t_type,false,false,
               false,false);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,".AsyncClient");
    std::__cxx11::string::operator=(local_38,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public static class AsyncClient extends ");
  poVar4 = std::operator<<(poVar4,local_38);
  poVar4 = std::operator<<(poVar4," implements AsyncIface {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "public static class Factory implements org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "  private org.apache.thrift.async.TAsyncClientManager clientManager;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;")
  ;
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "  public Factory(org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.protocol.TProtocolFactory protocolFactory) {"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"    this.clientManager = clientManager;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"    this.protocolFactory = protocolFactory;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  }");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "  public AsyncClient getAsyncClient(org.apache.thrift.transport.TNonblockingTransport transport) {"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "    return new AsyncClient(protocolFactory, clientManager, transport);")
  ;
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  }");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,
                           "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.transport.TNonblockingTransport transport) {"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  super(protocolFactory, clientManager, transport);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_d8);
  local_e8._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_e0,&local_e8);
  local_d8._M_current = local_e0;
  while( true ) {
    funname.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d8,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&funname.field_2 + 8));
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    psVar6 = t_function::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8),(string *)psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_130,"_",(allocator *)(javaname.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(javaname.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_158,(string *)(sep.field_2._M_local_buf + 8));
    if ((this->fullcamel_style_ & 1U) != 0) {
      std::__cxx11::string::operator=((string *)local_130,"");
      std::__cxx11::string::string((string *)&ret_type,(string *)local_158);
      as_camel_case(&local_178,this,(string *)&ret_type,true);
      std::__cxx11::string::operator=((string *)local_158,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&ret_type);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    ttype = t_function::get_returntype(*pptVar5);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    funclassname.field_2._8_8_ = t_function::get_arglist(*pptVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sep.field_2 + 8),"_call");
    this_00 = t_struct::get_members((t_struct *)funclassname.field_2._8_8_);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    this_01 = t_function::get_xceptions(*pptVar5);
    this_02 = t_struct::get_members(this_01);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)((long)&args_name.field_2 + 8));
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    psVar6 = t_function::get_name_abi_cxx11_(*pptVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&result_name.field_2 + 8),psVar6,"_args");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    psVar6 = t_function::get_name_abi_cxx11_(*pptVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                   psVar6,"_result");
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"public ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    tfunction = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"",&local_261);
    function_signature_async(&local_240,this,tfunction,false,&local_260);
    poVar4 = std::operator<<(poVar4,(string *)&local_240);
    poVar4 = std::operator<<(poVar4," throws org.apache.thrift.TException {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"  checkReady();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&fields);
    std::operator+(&local_2a8," method_call = new ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields);
    std::operator+(&local_288,&local_2a8,"(");
    poVar4 = std::operator<<(poVar4,(string *)&local_288);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    async_argument_list_abi_cxx11_
              (&local_2c8,this,*pptVar5,(t_struct *)funclassname.field_2._8_8_,ttype,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_2c8);
    poVar4 = std::operator<<(poVar4,", this, ___protocolFactory, ___transport);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"  this.___currentMethod = method_call;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"  ___manager.call(method_call);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    std::operator+(&local_348,"public static class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields);
    std::operator+(&local_328,&local_348," extends org.apache.thrift.async.TAsyncMethodCall<");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    ptVar7 = t_function::get_returntype(*pptVar5);
    type_name_abi_cxx11_(&local_368,this,ptVar7,true,false,false,false);
    std::operator+(&local_308,&local_328,&local_368);
    std::operator+(&local_2e8,&local_308,"> {");
    poVar4 = std::operator<<(poVar4,(string *)&local_2e8);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    t_generator::indent_up((t_generator *)this);
    local_370 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    args_name.field_2._8_8_ = local_370;
    while( true ) {
      local_378._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&args_name.field_2 + 8),&local_378);
      if (!bVar1) break;
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_418,this,ptVar7,false,false,false,false);
      std::operator+(&local_3f8,"private ",&local_418);
      std::operator+(&local_3d8,&local_3f8," ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar8);
      std::operator+(&local_3b8,&local_3d8,psVar6);
      std::operator+(&local_398,&local_3b8,";");
      poVar4 = std::operator<<(poVar4,(string *)&local_398);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&args_name.field_2 + 8));
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    std::operator+(&local_478,"public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields);
    std::operator+(&local_458,&local_478,"(");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    async_argument_list_abi_cxx11_
              (&local_498,this,*pptVar5,(t_struct *)funclassname.field_2._8_8_,ttype,true);
    std::operator+(&local_438,&local_458,&local_498);
    poVar4 = std::operator<<(poVar4,(string *)&local_438);
    poVar4 = std::operator<<(poVar4,
                             ", org.apache.thrift.async.TAsyncClient client, org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.transport.TNonblockingTransport transport) throws org.apache.thrift.TException {"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"  super(client, protocolFactory, transport, resultHandler, ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    bVar1 = t_function::is_oneway(*pptVar5);
    pcVar9 = "false";
    if (bVar1) {
      pcVar9 = "true";
    }
    poVar4 = std::operator<<(poVar4,pcVar9);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    local_4a0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    args_name.field_2._8_8_ = local_4a0;
    while( true ) {
      local_4a8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&args_name.field_2 + 8),&local_4a8);
      if (!bVar1) break;
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar8);
      std::operator+(&local_528,"  this.",psVar6);
      std::operator+(&local_508,&local_528," = ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar8);
      std::operator+(&local_4e8,&local_508,psVar6);
      std::operator+(&local_4c8,&local_4e8,";");
      poVar4 = std::operator<<(poVar4,(string *)&local_4c8);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&args_name.field_2 + 8));
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,
                             "public void write_args(org.apache.thrift.protocol.TProtocol prot) throws org.apache.thrift.TException {"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_548,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_548);
    poVar4 = std::operator<<(poVar4,
                             "prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\"");
    poVar4 = std::operator<<(poVar4,(string *)(sep.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"\", org.apache.thrift.protocol.");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_d8);
    bVar1 = t_function::is_oneway(*pptVar5);
    pcVar9 = "TMessageType.CALL";
    if (bVar1) {
      pcVar9 = "TMessageType.ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar9);
    poVar4 = std::operator<<(poVar4,", 0));");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_568,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_568);
    poVar4 = std::operator<<(poVar4,(string *)(result_name.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4," args = new ");
    poVar4 = std::operator<<(poVar4,(string *)(result_name.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_548);
    local_570 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    args_name.field_2._8_8_ = local_570;
    while( true ) {
      local_578._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&args_name.field_2 + 8),&local_578);
      if (!bVar1) break;
      t_generator::indent_abi_cxx11_(&local_598,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_598);
      poVar4 = std::operator<<(poVar4,"args.set");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar8);
      std::__cxx11::string::string((string *)&local_5d8,(string *)psVar6);
      get_cap_name(&local_5b8,this,&local_5d8);
      poVar4 = std::operator<<(poVar4,(string *)&local_5b8);
      poVar4 = std::operator<<(poVar4,"(");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&args_name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_598);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&args_name.field_2 + 8));
    }
    t_generator::indent_abi_cxx11_(&local_5f8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_5f8);
    poVar4 = std::operator<<(poVar4,"args.write(prot);");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_618,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_618);
    poVar4 = std::operator<<(poVar4,"prot.writeMessageEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f8);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    type_name_abi_cxx11_((string *)&x_iter,this,ttype,true,false,false,false);
    std::operator+(&local_658,"public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x_iter);
    std::operator+(&local_638,&local_658," getResult() throws ");
    std::operator<<(poVar4,(string *)&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&x_iter);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_680);
    local_688 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_02);
    local_680._M_current = local_688;
    while( true ) {
      local_690._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_02);
      bVar1 = __gnu_cxx::operator!=(&local_680,&local_690);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_680);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_6d0,this,ptVar7,false,false,false,false);
      std::operator+(&local_6b0,&local_6d0,", ");
      std::operator<<((ostream *)&this->f_service_,(string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_680);
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,"org.apache.thrift.TException {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_6f0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_6f0);
    poVar4 = std::operator<<(poVar4,
                             "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {"
                            );
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_710,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_710);
    poVar4 = std::operator<<(poVar4,
                             "  throw new java.lang.IllegalStateException(\"Method call not finished!\");"
                            );
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_730,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_730);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_750,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_750);
    poVar4 = std::operator<<(poVar4,
                             "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());"
                            );
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_770,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_770);
    poVar4 = std::operator<<(poVar4,
                             "org.apache.thrift.protocol.TProtocol prot = client.getProtocolFactory().getProtocol(memoryTransport);"
                            );
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_6f0);
    t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_7d0,"return (new Client(prot)).recv",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      std::operator+(&local_7b0,&local_7d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_790,&local_7b0,"();");
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_790);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_790);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::__cxx11::string::~string((string *)&local_7d0);
    }
    else {
      poVar4 = std::operator<<((ostream *)&this->f_service_,"return null;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)(result_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&fields);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_d8);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_java_generator::generate_service_async_client(t_service* tservice) {
  string extends = "org.apache.thrift.async.TAsyncClient";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends()) + ".AsyncClient";
  }

  indent(f_service_) << "public static class AsyncClient extends " << extends
                     << " implements AsyncIface {" << endl;
  indent_up();

  // Factory method
  indent(f_service_) << "public static class Factory implements "
                        "org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {" << endl;
  indent(f_service_) << "  private org.apache.thrift.async.TAsyncClientManager clientManager;"
                     << endl;
  indent(f_service_) << "  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;"
                     << endl;
  indent(f_service_) << "  public Factory(org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory) {" << endl;
  indent(f_service_) << "    this.clientManager = clientManager;" << endl;
  indent(f_service_) << "    this.protocolFactory = protocolFactory;" << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "  public AsyncClient "
                        "getAsyncClient(org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "    return new AsyncClient(protocolFactory, clientManager, transport);"
                     << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory, org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "  super(protocolFactory, clientManager, transport);" << endl;
  indent(f_service_) << "}" << endl << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();
    string sep = "_";
    string javaname = funname;
    if (fullcamel_style_) {
      sep = "";
      javaname = as_camel_case(javaname);
    }
    t_type* ret_type = (*f_iter)->get_returntype();
    t_struct* arg_struct = (*f_iter)->get_arglist();
    string funclassname = funname + "_call";
    const vector<t_field*>& fields = arg_struct->get_members();
    const std::vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string args_name = (*f_iter)->get_name() + "_args";
    string result_name = (*f_iter)->get_name() + "_result";

    // Main method body
    indent(f_service_) << "public " << function_signature_async(*f_iter, false)
                       << " throws org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  checkReady();" << endl;
    indent(f_service_) << "  " << funclassname << " method_call = new " + funclassname + "("
                       << async_argument_list(*f_iter, arg_struct, ret_type)
                       << ", this, ___protocolFactory, ___transport);" << endl;
    indent(f_service_) << "  this.___currentMethod = method_call;" << endl;
    indent(f_service_) << "  ___manager.call(method_call);" << endl;
    indent(f_service_) << "}" << endl;

    f_service_ << endl;

    // TAsyncMethod object for this function call
    indent(f_service_) << "public static class " + funclassname
                          + " extends org.apache.thrift.async.TAsyncMethodCall<"
                          + type_name((*f_iter)->get_returntype(), true) + "> {" << endl;
    indent_up();

    // Member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "private " + type_name((*fld_iter)->get_type()) + " "
                            + (*fld_iter)->get_name() + ";" << endl;
    }

    // NOTE since we use a new Client instance to deserialize, let's keep seqid to 0 for now
    // indent(f_service_) << "private int seqid;" << endl << endl;

    // Constructor
    indent(f_service_) << "public " + funclassname + "("
                          + async_argument_list(*f_iter, arg_struct, ret_type, true)
                       << ", org.apache.thrift.async.TAsyncClient client, "
                          "org.apache.thrift.protocol.TProtocolFactory protocolFactory, "
                          "org.apache.thrift.transport.TNonblockingTransport transport) throws "
                          "org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  super(client, protocolFactory, transport, resultHandler, "
                       << ((*f_iter)->is_oneway() ? "true" : "false") << ");" << endl;

    // Assign member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "  this." + (*fld_iter)->get_name() + " = " + (*fld_iter)->get_name()
                            + ";" << endl;
    }

    indent(f_service_) << "}" << endl << endl;

    indent(f_service_) << "public void write_args(org.apache.thrift.protocol.TProtocol prot) "
                          "throws org.apache.thrift.TException {" << endl;
    indent_up();

    // Serialize request
    // NOTE we are leaving seqid as 0, for now (see above)
    f_service_ << indent() << "prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\""
               << funname << "\", org.apache.thrift.protocol."
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL") << ", 0));"
               << endl << indent() << args_name << " args = new " << args_name << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(prot);" << endl << indent() << "prot.writeMessageEnd();"
               << endl;

    indent_down();
    indent(f_service_) << "}" << endl << endl;

    // Return method
    indent(f_service_) << "public " + type_name(ret_type, true) + " getResult() throws ";
    vector<t_field*>::const_iterator x_iter;
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << type_name((*x_iter)->get_type(), false, false) + ", ";
    }
    f_service_ << "org.apache.thrift.TException {" << endl;

    indent_up();
    f_service_
        << indent()
        << "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {"
        << endl << indent() << "  throw new java.lang.IllegalStateException(\"Method call not finished!\");"
        << endl << indent() << "}" << endl << indent()
        << "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new "
           "org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());" << endl
        << indent() << "org.apache.thrift.protocol.TProtocol prot = "
                       "client.getProtocolFactory().getProtocol(memoryTransport);" << endl;
    indent(f_service_);
    if (ret_type->is_void()) { // NB: Includes oneways which always return void.
      f_service_ << "return null;" << endl;
    } else {
      f_service_ << "return (new Client(prot)).recv" + sep + javaname + "();" << endl;
    }

    // Close function
    indent_down();
    indent(f_service_) << "}" << endl;

    // Close class
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }

  // Close AsyncClient
  scope_down(f_service_);
  f_service_ << endl;
}